

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::
HeapDisposer<kj::_::ImmediatePromiseNode<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>_>
::disposeImpl(HeapDisposer<kj::_::ImmediatePromiseNode<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>_>
              *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    ExceptionOr<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>::
    ~ExceptionOr((ExceptionOr<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                  *)((long)pointer + 8));
    ImmediatePromiseNodeBase::~ImmediatePromiseNodeBase((ImmediatePromiseNodeBase *)pointer);
  }
  operator_delete(pointer,0x178);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }